

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O3

void ExportSkin(Asset *mAsset,aiMesh *aimesh,Ref<glTF::Mesh> *meshRef,Ref<glTF::Buffer> *bufferRef,
               Ref<glTF::Skin> *skinRef,
               vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
               *inverseBindMatricesData)

{
  pointer *ppRVar1;
  pointer *ppRVar2;
  float fVar3;
  iterator __position;
  aiVertexWeight *paVar4;
  pointer pPVar5;
  iterator iVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  Ref<glTF::Buffer> *buffer;
  int iVar9;
  void *__s;
  void *__s_00;
  void *pvVar10;
  Ref<glTF::Node> *pRVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  iterator __position_00;
  ulong uVar15;
  Skin *pSVar16;
  long lVar17;
  uint uVar18;
  pointer paVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar24;
  Ref<glTF::Node> RVar25;
  Ref<glTF::Accessor> RVar26;
  Ref<glTF::Accessor> vertexWeightAccessor;
  Ref<glTF::Accessor> vertexJointAccessor;
  Ref<glTF::Accessor> local_d8;
  Asset *local_c8;
  aiMesh *local_c0;
  vector<aiMatrix4x4t<float>,std::allocator<aiMatrix4x4t<float>>> *local_b8;
  aiBone *local_b0;
  Ref<glTF::Mesh> *local_a8;
  Ref<glTF::Buffer> *local_a0;
  void *local_98;
  void *local_90;
  LazyDict<glTF::Node> *local_88;
  ulong local_80;
  aiMatrix4x4t<float> local_78;
  
  if (aimesh->mNumBones != 0) {
    uVar15 = (ulong)aimesh->mNumVertices;
    uVar12 = uVar15 << 4;
    local_c0 = aimesh;
    local_b8 = (vector<aiMatrix4x4t<float>,std::allocator<aiMatrix4x4t<float>>> *)
               inverseBindMatricesData;
    local_a8 = meshRef;
    local_a0 = bufferRef;
    __s = operator_new__(uVar12);
    __s_00 = operator_new__(uVar12);
    pvVar10 = operator_new__(uVar15 * 4);
    local_c8 = mAsset;
    if (uVar15 != 0) {
      uVar13 = 0;
      memset(__s,0,uVar12);
      mAsset = local_c8;
      memset(__s_00,0,uVar12);
      auVar8 = _DAT_006a4680;
      lVar17 = uVar15 - 1;
      auVar20._8_4_ = (int)lVar17;
      auVar20._0_8_ = lVar17;
      auVar20._12_4_ = (int)((ulong)lVar17 >> 0x20);
      auVar20 = auVar20 ^ _DAT_006a4680;
      auVar21 = _DAT_006a61e0;
      auVar22 = _DAT_006a61f0;
      do {
        auVar23 = auVar22 ^ auVar8;
        iVar9 = auVar20._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar9 && auVar20._0_4_ < auVar23._0_4_ ||
                    iVar9 < auVar23._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar10 + uVar13) = 0;
        }
        if ((auVar23._12_4_ != auVar20._12_4_ || auVar23._8_4_ <= auVar20._8_4_) &&
            auVar23._12_4_ <= auVar20._12_4_) {
          *(undefined4 *)((long)pvVar10 + uVar13 + 4) = 0;
        }
        auVar23 = auVar21 ^ auVar8;
        iVar24 = auVar23._4_4_;
        if (iVar24 <= iVar9 && (iVar24 != iVar9 || auVar23._0_4_ <= auVar20._0_4_)) {
          *(undefined4 *)((long)pvVar10 + uVar13 + 8) = 0;
          *(undefined4 *)((long)pvVar10 + uVar13 + 0xc) = 0;
        }
        lVar17 = auVar22._8_8_;
        auVar22._0_8_ = auVar22._0_8_ + 4;
        auVar22._8_8_ = lVar17 + 4;
        lVar17 = auVar21._8_8_;
        auVar21._0_8_ = auVar21._0_8_ + 4;
        auVar21._8_8_ = lVar17 + 4;
        uVar13 = uVar13 + 0x10;
      } while ((uVar15 * 4 + 0xc & 0xfffffffffffffff0) != uVar13);
    }
    local_88 = &mAsset->nodes;
    uVar12 = 0;
    local_98 = __s_00;
    local_90 = __s;
    do {
      local_b0 = local_c0->mBones[uVar12];
      local_80 = uVar12;
      RVar25 = glTF::LazyDict<glTF::Node>::Get(local_88,(local_b0->mName).data);
      local_d8.vector = (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)RVar25.vector
      ;
      local_d8.index = RVar25.index;
      std::__cxx11::string::_M_assign
                ((string *)
                 &(((_Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_> *)
                   &(local_d8.vector)->
                    super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)->
                  _M_impl).super__Vector_impl_data._M_start[local_d8.index]->jointName);
      pSVar16 = (skinRef->vector->super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>).
                _M_impl.super__Vector_impl_data._M_start[skinRef->index];
      pRVar11 = *(Ref<glTF::Node> **)
                 &(pSVar16->jointNames).
                  super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
                  ._M_impl;
      __position_00._M_current =
           *(pointer *)
            ((long)&(pSVar16->jointNames).
                    super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
            + 8);
      if (__position_00._M_current == pRVar11) {
LAB_00360205:
        if (__position_00._M_current ==
            *(pointer *)
             ((long)&(pSVar16->jointNames).
                     super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
             + 0x10)) {
          std::vector<glTF::Ref<glTF::Node>,std::allocator<glTF::Ref<glTF::Node>>>::
          _M_realloc_insert<glTF::Ref<glTF::Node>const&>
                    ((vector<glTF::Ref<glTF::Node>,std::allocator<glTF::Ref<glTF::Node>>> *)
                     &pSVar16->jointNames,__position_00,(Ref<glTF::Node> *)&local_d8);
        }
        else {
          (__position_00._M_current)->vector =
               (vector<glTF::Node_*,_std::allocator<glTF::Node_*>_> *)local_d8.vector;
          *(ulong *)&(__position_00._M_current)->index = CONCAT44(local_d8._12_4_,local_d8.index);
          ppRVar2 = (pointer *)
                    ((long)&(pSVar16->jointNames).
                            super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
                    + 8);
          *ppRVar2 = *ppRVar2 + 1;
        }
        local_78._0_8_ = *(undefined8 *)&local_b0->mOffsetMatrix;
        local_78.a3 = (local_b0->mOffsetMatrix).a3;
        local_78.a4 = (local_b0->mOffsetMatrix).a4;
        local_78.b1 = (local_b0->mOffsetMatrix).b1;
        local_78.b2 = (local_b0->mOffsetMatrix).b2;
        local_78.b3 = (local_b0->mOffsetMatrix).b3;
        local_78.b4 = (local_b0->mOffsetMatrix).b4;
        local_78.c1 = (local_b0->mOffsetMatrix).c1;
        local_78.c2 = (local_b0->mOffsetMatrix).c2;
        local_78.c3 = (local_b0->mOffsetMatrix).c3;
        local_78.c4 = (local_b0->mOffsetMatrix).c4;
        local_78.d1 = (local_b0->mOffsetMatrix).d1;
        local_78.d2 = (local_b0->mOffsetMatrix).d2;
        local_78.d3 = (local_b0->mOffsetMatrix).d3;
        local_78.d4 = (local_b0->mOffsetMatrix).d4;
        __position._M_current = *(aiMatrix4x4t<float> **)(local_b8 + 8);
        if (__position._M_current == *(aiMatrix4x4t<float> **)(local_b8 + 0x10)) {
          std::vector<aiMatrix4x4t<float>,std::allocator<aiMatrix4x4t<float>>>::
          _M_realloc_insert<aiMatrix4x4t<float>const&>(local_b8,__position,&local_78);
          paVar19 = *(pointer *)(local_b8 + 8);
        }
        else {
          (__position._M_current)->d1 = local_78.d1;
          (__position._M_current)->d2 = local_78.d2;
          (__position._M_current)->d3 = local_78.d3;
          (__position._M_current)->d4 = local_78.d4;
          (__position._M_current)->c1 = local_78.c1;
          (__position._M_current)->c2 = local_78.c2;
          (__position._M_current)->c3 = local_78.c3;
          (__position._M_current)->c4 = local_78.c4;
          (__position._M_current)->b1 = local_78.b1;
          (__position._M_current)->b2 = local_78.b2;
          (__position._M_current)->b3 = local_78.b3;
          (__position._M_current)->b4 = local_78.b4;
          *(undefined8 *)__position._M_current = local_78._0_8_;
          (__position._M_current)->a3 = local_78.a3;
          (__position._M_current)->a4 = local_78.a4;
          paVar19 = (pointer)(*(long *)(local_b8 + 8) + 0x40);
          *(pointer *)(local_b8 + 8) = paVar19;
        }
        uVar18 = (int)((ulong)((long)paVar19 - *(long *)local_b8) >> 6) - 1;
      }
      else {
        bVar7 = true;
        uVar12 = 0;
        uVar14 = 1;
        uVar18 = 0;
        do {
          iVar9 = std::__cxx11::string::compare
                            ((string *)
                             &((pRVar11[uVar12].vector)->
                              super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>).
                              _M_impl.super__Vector_impl_data._M_start[pRVar11[uVar12].index]->
                              jointName);
          if (iVar9 == 0) {
            uVar18 = uVar14 - 1;
          }
          bVar7 = (bool)(bVar7 & iVar9 != 0);
          uVar12 = (ulong)uVar14;
          pSVar16 = (skinRef->vector->
                    super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[skinRef->index];
          pRVar11 = *(Ref<glTF::Node> **)
                     &(pSVar16->jointNames).
                      super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
                      ._M_impl;
          __position_00._M_current =
               *(pointer *)
                ((long)&(pSVar16->jointNames).
                        super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
                + 8);
          uVar14 = uVar14 + 1;
        } while (uVar12 < (ulong)((long)__position_00._M_current - (long)pRVar11 >> 4));
        __s_00 = local_98;
        __s = local_90;
        if (bVar7) goto LAB_00360205;
      }
      buffer = local_a0;
      uVar14 = local_b0->mNumWeights;
      if ((ulong)uVar14 != 0) {
        paVar4 = local_b0->mWeights;
        uVar12 = 0;
        do {
          uVar15 = (ulong)paVar4[uVar12].mVertexId;
          iVar9 = *(int *)((long)pvVar10 + uVar15 * 4);
          lVar17 = (long)iVar9;
          if (lVar17 < 4) {
            fVar3 = paVar4[uVar12].mWeight;
            *(float *)((long)__s + lVar17 * 4 + uVar15 * 0x10) = (float)uVar18;
            *(float *)((long)__s_00 + lVar17 * 4 + uVar15 * 0x10) = fVar3;
            *(int *)((long)pvVar10 + uVar15 * 4) = iVar9 + 1;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < uVar14);
      }
      uVar12 = local_80 + 1;
    } while (uVar12 < local_c0->mNumBones);
    pPVar5 = *(pointer *)
              ((long)&((local_a8->vector->
                       super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[local_a8->index]->primitives).
                      super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
              + 8);
    RVar26 = ExportData(local_c8,&((skinRef->vector->
                                   super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>).
                                   _M_impl.super__Vector_impl_data._M_start[skinRef->index]->
                                  super_Object).id,local_a0,local_c0->mNumVertices,__s,VEC4,VEC4,
                        ComponentType_FLOAT,false);
    local_78._0_8_ = RVar26.vector;
    local_78.a3 = (float)RVar26.index;
    if ((vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)local_78._0_8_ !=
        (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
      iVar6._M_current = *(pointer *)((long)&pPVar5[-1].attributes.joint + 8);
      if (iVar6._M_current == *(pointer *)((long)&pPVar5[-1].attributes.joint + 0x10)) {
        std::vector<glTF::Ref<glTF::Accessor>,std::allocator<glTF::Ref<glTF::Accessor>>>::
        _M_realloc_insert<glTF::Ref<glTF::Accessor>const&>
                  ((vector<glTF::Ref<glTF::Accessor>,std::allocator<glTF::Ref<glTF::Accessor>>> *)
                   &pPVar5[-1].attributes.joint,iVar6,(Ref<glTF::Accessor> *)&local_78);
      }
      else {
        (iVar6._M_current)->vector =
             (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)local_78._0_8_;
        (iVar6._M_current)->index = RVar26.index;
        *(float *)&(iVar6._M_current)->field_0xc = local_78.a4;
        ppRVar1 = (pointer *)((long)&pPVar5[-1].attributes.joint + 8);
        *ppRVar1 = *ppRVar1 + 1;
      }
    }
    RVar26 = ExportData(local_c8,&((skinRef->vector->
                                   super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>).
                                   _M_impl.super__Vector_impl_data._M_start[skinRef->index]->
                                  super_Object).id,buffer,local_c0->mNumVertices,__s_00,VEC4,VEC4,
                        ComponentType_FLOAT,false);
    local_d8.vector = RVar26.vector;
    local_d8.index = RVar26.index;
    if (local_d8.vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
      iVar6._M_current = *(pointer *)((long)&pPVar5[-1].attributes.weight + 8);
      if (iVar6._M_current == *(pointer *)((long)&pPVar5[-1].attributes.weight + 0x10)) {
        std::vector<glTF::Ref<glTF::Accessor>,std::allocator<glTF::Ref<glTF::Accessor>>>::
        _M_realloc_insert<glTF::Ref<glTF::Accessor>const&>
                  ((vector<glTF::Ref<glTF::Accessor>,std::allocator<glTF::Ref<glTF::Accessor>>> *)
                   &pPVar5[-1].attributes.weight,iVar6,&local_d8);
      }
      else {
        (iVar6._M_current)->vector = local_d8.vector;
        *(ulong *)&(iVar6._M_current)->index = CONCAT44(local_d8._12_4_,local_d8.index);
        ppRVar1 = (pointer *)((long)&pPVar5[-1].attributes.weight + 8);
        *ppRVar1 = *ppRVar1 + 1;
      }
    }
    operator_delete__(pvVar10);
    operator_delete__(__s_00);
    operator_delete__(__s);
  }
  return;
}

Assistant:

void ExportSkin(Asset& mAsset, const aiMesh* aimesh, Ref<Mesh>& meshRef, Ref<Buffer>& bufferRef, Ref<Skin>& skinRef, std::vector<aiMatrix4x4>& inverseBindMatricesData)
{
    if (aimesh->mNumBones < 1) {
        return;
    }

    // Store the vertex joint and weight data.
    const size_t NumVerts( aimesh->mNumVertices );
    vec4* vertexJointData = new vec4[ NumVerts ];
    vec4* vertexWeightData = new vec4[ NumVerts ];
    int* jointsPerVertex = new int[ NumVerts ];
    for (size_t i = 0; i < NumVerts; ++i) {
        jointsPerVertex[i] = 0;
        for (size_t j = 0; j < 4; ++j) {
            vertexJointData[i][j] = 0;
            vertexWeightData[i][j] = 0;
        }
    }

    for (unsigned int idx_bone = 0; idx_bone < aimesh->mNumBones; ++idx_bone) {
        const aiBone* aib = aimesh->mBones[idx_bone];

        // aib->mName   =====>  skinRef->jointNames
        // Find the node with id = mName.
        Ref<Node> nodeRef = mAsset.nodes.Get(aib->mName.C_Str());
        nodeRef->jointName = nodeRef->id;

        unsigned int jointNamesIndex = 0;
        bool addJointToJointNames = true;
        for ( unsigned int idx_joint = 0; idx_joint < skinRef->jointNames.size(); ++idx_joint) {
            if (skinRef->jointNames[idx_joint]->jointName.compare(nodeRef->jointName) == 0) {
                addJointToJointNames = false;
                jointNamesIndex = idx_joint;
            }
        }

        if (addJointToJointNames) {
            skinRef->jointNames.push_back(nodeRef);

            // aib->mOffsetMatrix   =====>  skinRef->inverseBindMatrices
            aiMatrix4x4 tmpMatrix4;
            CopyValue(aib->mOffsetMatrix, tmpMatrix4);
            inverseBindMatricesData.push_back(tmpMatrix4);
            jointNamesIndex = static_cast<unsigned int>(inverseBindMatricesData.size() - 1);
        }

        // aib->mWeights   =====>  vertexWeightData
        for (unsigned int idx_weights = 0; idx_weights < aib->mNumWeights; ++idx_weights) {
            unsigned int vertexId = aib->mWeights[idx_weights].mVertexId;
            float vertWeight      = aib->mWeights[idx_weights].mWeight;

            // A vertex can only have at most four joint weights. Ignore all others.
            if (jointsPerVertex[vertexId] > 3) {
                continue;
            }

            vertexJointData[vertexId][jointsPerVertex[vertexId]] = static_cast<float>(jointNamesIndex);
            vertexWeightData[vertexId][jointsPerVertex[vertexId]] = vertWeight;

            jointsPerVertex[vertexId] += 1;
        }

    } // End: for-loop mNumMeshes

    Mesh::Primitive& p = meshRef->primitives.back();
    Ref<Accessor> vertexJointAccessor = ExportData(mAsset, skinRef->id, bufferRef, aimesh->mNumVertices, vertexJointData, AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT);
    if ( vertexJointAccessor ) {
        p.attributes.joint.push_back( vertexJointAccessor );
    }

    Ref<Accessor> vertexWeightAccessor = ExportData(mAsset, skinRef->id, bufferRef, aimesh->mNumVertices, vertexWeightData, AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT);
    if ( vertexWeightAccessor ) {
        p.attributes.weight.push_back( vertexWeightAccessor );
    }
    delete[] jointsPerVertex;
    delete[] vertexWeightData;
    delete[] vertexJointData;
}